

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

bool __thiscall QTextStreamPrivate::getReal(QTextStreamPrivate *this,double *f)

{
  QChar ch;
  QChar ch_00;
  QByteArrayView ba;
  bool bVar1;
  char cVar2;
  int iVar3;
  char16_t *pcVar4;
  double *in_RSI;
  undefined1 *puVar5;
  QChar **in_RDI;
  long in_FS_OFFSET;
  double dVar6;
  qsizetype i;
  qsizetype BufferSize;
  InputToken input;
  ParserState state;
  bool ok;
  QChar lc;
  QChar c;
  char buf [128];
  QString *in_stack_fffffffffffffd88;
  QTextStreamPrivate *in_stack_fffffffffffffd90;
  undefined6 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  QTextStreamPrivate *in_stack_fffffffffffffda0;
  QByteArrayView *this_00;
  QString *s;
  QLocale *in_stack_fffffffffffffdb0;
  bool local_233;
  bool local_231;
  TokenDelimiter in_stack_fffffffffffffdec;
  uint uVar7;
  qsizetype in_stack_fffffffffffffdf0;
  qsizetype *in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe09;
  undefined1 in_stack_fffffffffffffe0a;
  byte bVar8;
  undefined1 in_stack_fffffffffffffe0b;
  byte bVar9;
  undefined4 in_stack_fffffffffffffe0c;
  long local_1e8;
  uint local_1d8;
  uint local_1d4;
  QChar **ppQVar10;
  bool local_1b9;
  QString local_1a8;
  byte local_18d;
  char16_t local_18c;
  char16_t local_18a;
  undefined1 local_158 [32];
  undefined1 local_138 [48];
  undefined1 local_108 [124];
  char16_t local_8c;
  QChar local_8a;
  char local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d4 = 0;
  ppQVar10 = in_RDI;
  scan((QTextStreamPrivate *)
       CONCAT44(in_stack_fffffffffffffe0c,
                CONCAT13(in_stack_fffffffffffffe0b,
                         CONCAT12(in_stack_fffffffffffffe0a,
                                  CONCAT11(in_stack_fffffffffffffe09,in_stack_fffffffffffffe08)))),
       in_RDI,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  consumeLastToken(in_stack_fffffffffffffd90);
  memset(local_88,0xaa,0x80);
  local_1e8 = 0;
  local_8a.ucs = L'ꪪ';
  QChar::QChar(&local_8a);
  while (bVar1 = getChar(in_stack_fffffffffffffda0,
                         (QChar *)CONCAT17(in_stack_fffffffffffffd9f,
                                           CONCAT16(in_stack_fffffffffffffd9e,
                                                    in_stack_fffffffffffffd98))), bVar1) {
    pcVar4 = QChar::unicode(&local_8a);
    switch(*pcVar4) {
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
      local_1d8 = 2;
      break;
    default:
      local_8c = 0xaaaa;
      local_8c = (char16_t)QChar::toLower((QChar *)in_stack_fffffffffffffd90);
      QLocale::decimalPoint
                ((QLocale *)
                 CONCAT17(in_stack_fffffffffffffd9f,
                          CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
      QString::toLower(in_stack_fffffffffffffd88);
      bVar1 = ::operator==((QChar *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      uVar7 = (uint)bVar1 << 0x18;
      QString::~QString((QString *)0x4a9d50);
      QString::~QString((QString *)0x4a9d5d);
      if ((uVar7 & 0x1000000) == 0) {
        QLocale::exponential
                  ((QLocale *)
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
        QString::toLower(in_stack_fffffffffffffd88);
        bVar1 = ::operator==((QChar *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        QString::~QString((QString *)0x4a9df9);
        QString::~QString((QString *)0x4a9e06);
        if (bVar1) {
          local_1d8 = 4;
        }
        else {
          QLocale::negativeSign
                    ((QLocale *)
                     CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
          bVar9 = 0;
          bVar8 = 0;
          QString::toLower(in_stack_fffffffffffffd88);
          puVar5 = local_108;
          bVar1 = ::operator==((QChar *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          local_231 = true;
          if (!bVar1) {
            QLocale::positiveSign
                      ((QLocale *)
                       CONCAT17(in_stack_fffffffffffffd9f,
                                CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
            bVar9 = 1;
            QString::toLower(in_stack_fffffffffffffd88);
            bVar8 = 1;
            puVar5 = local_138;
            local_231 = ::operator==((QChar *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          }
          if ((bVar8 & 1) != 0) {
            QString::~QString((QString *)0x4a9f2a);
          }
          if ((bVar9 & 1) != 0) {
            QString::~QString((QString *)0x4a9f43);
          }
          QString::~QString((QString *)0x4a9f50);
          QString::~QString((QString *)0x4a9f5d);
          if (local_231 == false) {
            QLocale::c(local_158,puVar5);
            bVar1 = ::operator!=((QLocale *)in_stack_fffffffffffffd90,
                                 (QLocale *)in_stack_fffffffffffffd88);
            bVar9 = 0;
            bVar8 = 0;
            local_233 = false;
            if (bVar1) {
              QLocale::groupSeparator
                        ((QLocale *)
                         CONCAT17(in_stack_fffffffffffffd9f,
                                  CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
              bVar9 = 1;
              QString::toLower(in_stack_fffffffffffffd88);
              bVar8 = 1;
              local_233 = ::operator==((QChar *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88)
              ;
            }
            if ((bVar8 & 1) != 0) {
              QString::~QString((QString *)0x4aa0ca);
            }
            if ((bVar9 & 1) != 0) {
              QString::~QString((QString *)0x4aa0e3);
            }
            QLocale::~QLocale((QLocale *)0x4aa0f0);
            if (local_233 == false) {
              local_1d8 = 0;
            }
            else {
              local_1d8 = 2;
            }
          }
          else {
            local_1d8 = 1;
          }
        }
      }
      else {
        local_1d8 = 3;
      }
      break;
    case L'A':
    case L'a':
      local_1d8 = 8;
      break;
    case L'F':
    case L'f':
      local_1d8 = 7;
      break;
    case L'I':
    case L'i':
      local_1d8 = 5;
      break;
    case L'N':
    case L'n':
      local_1d8 = 6;
      break;
    case L'T':
    case L't':
      local_1d8 = 9;
    }
    local_1d4 = (uint)getReal::table[local_1d4][local_1d8];
    if (((local_1d4 == 0) || (local_1d4 == 0xd)) || (0x7b < local_1e8)) {
      local_18a = local_8a.ucs;
      ch.ucs._1_1_ = in_stack_fffffffffffffd9f;
      ch.ucs._0_1_ = in_stack_fffffffffffffd9e;
      ungetChar(in_stack_fffffffffffffd90,ch);
      if (0x7b < local_1e8) goto LAB_004aa1f4;
      break;
    }
    cVar2 = QChar::toLatin1(&local_8a);
    local_88[local_1e8] = cVar2;
    local_1e8 = local_1e8 + 1;
  }
  goto LAB_004aa279;
  while (bVar1 = QChar::isDigit((QChar *)0x4aa219), bVar1) {
LAB_004aa1f4:
    bVar1 = getChar(in_stack_fffffffffffffda0,
                    (QChar *)CONCAT17(in_stack_fffffffffffffd9f,
                                      CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98))
                   );
    if (!bVar1) goto LAB_004aa279;
  }
  local_18c = local_8a.ucs;
  ch_00.ucs._1_1_ = in_stack_fffffffffffffd9f;
  ch_00.ucs._0_1_ = in_stack_fffffffffffffd9e;
  ungetChar(in_stack_fffffffffffffd90,ch_00);
LAB_004aa279:
  if (local_1e8 == 0) {
    local_1b9 = false;
  }
  else if (in_RSI == (double *)0x0) {
    local_1b9 = true;
  }
  else {
    local_88[local_1e8] = '\0';
    iVar3 = qstricmp((char *)in_stack_fffffffffffffda0,
                     (char *)CONCAT17(in_stack_fffffffffffffd9f,
                                      CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98))
                    );
    if (((iVar3 == 0) ||
        (iVar3 = qstricmp((char *)in_stack_fffffffffffffda0,
                          (char *)CONCAT17(in_stack_fffffffffffffd9f,
                                           CONCAT16(in_stack_fffffffffffffd9e,
                                                    in_stack_fffffffffffffd98))), iVar3 == 0)) ||
       (iVar3 = qstricmp((char *)in_stack_fffffffffffffda0,
                         (char *)CONCAT17(in_stack_fffffffffffffd9f,
                                          CONCAT16(in_stack_fffffffffffffd9e,
                                                   in_stack_fffffffffffffd98))), iVar3 == 0)) {
      dVar6 = qt_qnan();
      *in_RSI = dVar6;
      local_1b9 = true;
    }
    else {
      iVar3 = qstricmp((char *)in_stack_fffffffffffffda0,
                       (char *)CONCAT17(in_stack_fffffffffffffd9f,
                                        CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98
                                                )));
      if ((iVar3 == 0) ||
         (iVar3 = qstricmp((char *)in_stack_fffffffffffffda0,
                           (char *)CONCAT17(in_stack_fffffffffffffd9f,
                                            CONCAT16(in_stack_fffffffffffffd9e,
                                                     in_stack_fffffffffffffd98))), iVar3 == 0)) {
        dVar6 = qt_inf();
        *in_RSI = dVar6;
        local_1b9 = true;
      }
      else {
        iVar3 = qstricmp((char *)in_stack_fffffffffffffda0,
                         (char *)CONCAT17(in_stack_fffffffffffffd9f,
                                          CONCAT16(in_stack_fffffffffffffd9e,
                                                   in_stack_fffffffffffffd98)));
        if (iVar3 == 0) {
          dVar6 = qt_inf();
          *in_RSI = -dVar6;
          local_1b9 = true;
        }
        else {
          local_18d = 0xaa;
          this_00 = (QByteArrayView *)(in_RDI + 0x29);
          QByteArrayView::QByteArrayView<128ul>
                    (this_00,(char (*) [128])
                             CONCAT17(in_stack_fffffffffffffd9f,
                                      CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98))
                    );
          s = &local_1a8;
          ba.m_data = (storage_type *)ppQVar10;
          ba.m_size = (qsizetype)in_RSI;
          QString::fromLatin1(ba);
          dVar6 = QLocale::toDouble(in_stack_fffffffffffffdb0,s,(bool *)this_00);
          *in_RSI = dVar6;
          QString::~QString((QString *)0x4aa451);
          local_1b9 = (bool)(local_18d & 1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1b9;
  }
  __stack_chk_fail();
}

Assistant:

bool QTextStreamPrivate::getReal(double *f)
{
    // We use a table-driven FSM to parse floating point numbers
    // strtod() cannot be used directly since we may be reading from a
    // QIODevice.
    enum ParserState {
        Init = 0,
        Sign = 1,
        Mantissa = 2,
        Dot = 3,
        Abscissa = 4,
        ExpMark = 5,
        ExpSign = 6,
        Exponent = 7,
        Nan1 = 8,
        Nan2 = 9,
        Inf1 = 10,
        Inf2 = 11,
        NanInf = 12,
        Done = 13
    };
    enum InputToken {
        None = 0,
        InputSign = 1,
        InputDigit = 2,
        InputDot = 3,
        InputExp = 4,
        InputI = 5,
        InputN = 6,
        InputF = 7,
        InputA = 8,
        InputT = 9
    };

    static const uchar table[13][10] = {
        // None InputSign InputDigit InputDot InputExp InputI    InputN    InputF    InputA    InputT
        { 0,    Sign,     Mantissa,  Dot,     0,       Inf1,     Nan1,     0,        0,        0      }, // 0  Init
        { 0,    0,        Mantissa,  Dot,     0,       Inf1,     Nan1,     0,        0,        0      }, // 1  Sign
        { Done, Done,     Mantissa,  Dot,     ExpMark, 0,        0,        0,        0,        0      }, // 2  Mantissa
        { 0,    0,        Abscissa,  0,       0,       0,        0,        0,        0,        0      }, // 3  Dot
        { Done, Done,     Abscissa,  Done,    ExpMark, 0,        0,        0,        0,        0      }, // 4  Abscissa
        { 0,    ExpSign,  Exponent,  0,       0,       0,        0,        0,        0,        0      }, // 5  ExpMark
        { 0,    0,        Exponent,  0,       0,       0,        0,        0,        0,        0      }, // 6  ExpSign
        { Done, Done,     Exponent,  Done,    Done,    0,        0,        0,        0,        0      }, // 7  Exponent
        { 0,    0,        0,         0,       0,       0,        0,        0,        Nan2,     0      }, // 8  Nan1
        { 0,    0,        0,         0,       0,       0,        NanInf,   0,        0,        0      }, // 9  Nan2
        { 0,    0,        0,         0,       0,       0,        Inf2,     0,        0,        0      }, // 10 Inf1
        { 0,    0,        0,         0,       0,       0,        0,        NanInf,   0,        0      }, // 11 Inf2
        { Done, 0,        0,         0,       0,       0,        0,        0,        0,        0      }, // 11 NanInf
    };

    ParserState state = Init;
    InputToken input = None;

    scan(nullptr, nullptr, 0, NotSpace);
    consumeLastToken();

    const qsizetype BufferSize = 128;
    char buf[BufferSize];
    qsizetype i = 0;

    QChar c;
    while (getChar(&c)) {
        switch (c.unicode()) {
        case u'0': case u'1': case u'2': case u'3': case u'4':
        case u'5': case u'6': case u'7': case u'8': case u'9':
            input = InputDigit;
            break;
        case u'i': case u'I':
            input = InputI;
            break;
        case u'n': case u'N':
            input = InputN;
            break;
        case u'f': case u'F':
            input = InputF;
            break;
        case u'a': case u'A':
            input = InputA;
            break;
        case u't': case u'T':
            input = InputT;
            break;
        default: {
            QChar lc = c.toLower();
            if (lc == locale.decimalPoint().toLower())
                input = InputDot;
            else if (lc == locale.exponential().toLower())
                input = InputExp;
            else if (lc == locale.negativeSign().toLower()
                     || lc == locale.positiveSign().toLower())
                input = InputSign;
            else if (locale != QLocale::c() // backward-compatibility
                     && lc == locale.groupSeparator().toLower())
                input = InputDigit; // well, it isn't a digit, but no one cares.
            else
                input = None;
        }
            break;
        }

        state = ParserState(table[state][input]);

        if  (state == Init || state == Done || i > (BufferSize - 5)) {
            ungetChar(c);
            if (i > (BufferSize - 5)) { // ignore rest of digits
                while (getChar(&c)) {
                    if (!c.isDigit()) {
                        ungetChar(c);
                        break;
                    }
                }
            }
            break;
        }

        buf[i++] = c.toLatin1();
    }

    if (i == 0)
        return false;
    if (!f)
        return true;
    buf[i] = '\0';

    // backward-compatibility. Old implementation supported +nan/-nan
    // for some reason. QLocale only checks for lower-case
    // nan/+inf/-inf, so here we also check for uppercase and mixed
    // case versions.
    if (!qstricmp(buf, "nan") || !qstricmp(buf, "+nan") || !qstricmp(buf, "-nan")) {
        *f = qt_qnan();
        return true;
    } else if (!qstricmp(buf, "+inf") || !qstricmp(buf, "inf")) {
        *f = qt_inf();
        return true;
    } else if (!qstricmp(buf, "-inf")) {
        *f = -qt_inf();
        return true;
    }
    bool ok;
    *f = locale.toDouble(QString::fromLatin1(buf), &ok);
    return ok;
}